

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParseCharData(xmlParserCtxtPtr ctxt,int cdata)

{
  byte *pbVar1;
  byte bVar2;
  charactersSAXFunc UNRECOVERED_JUMPTABLE;
  charactersSAXFunc p_Var3;
  int iVar4;
  uint val;
  xmlType xVar5;
  int iVar6;
  xmlParserInputPtr pxVar7;
  ignorableWhitespaceSAXFunc p_Var8;
  int iVar9;
  xmlChar *pxVar10;
  _xmlSAXHandler *p_Var11;
  byte *pbVar12;
  uint len;
  byte *pbVar13;
  int len_00;
  bool bVar14;
  int local_16c;
  xmlChar buf [305];
  
  pxVar7 = ctxt->input;
  iVar4 = pxVar7->line;
  iVar6 = pxVar7->col;
  if (ctxt->progressive == 0) {
    if ((500 < (long)pxVar7->cur - (long)pxVar7->base) &&
       ((long)pxVar7->end - (long)pxVar7->cur < 500)) {
      xmlSHRINK(ctxt);
      pxVar7 = ctxt->input;
      if (ctxt->progressive != 0) goto LAB_0015bad3;
    }
    if ((long)pxVar7->end - (long)pxVar7->cur < 0xfa) {
      xmlGROW(ctxt);
      pxVar7 = ctxt->input;
    }
  }
LAB_0015bad3:
  if ((cdata == 0) && (ctxt->mlType == XML_TYPE_XML)) {
    pbVar13 = pxVar7->cur;
    do {
      while( true ) {
        while (bVar2 = *pbVar13, bVar2 == 10) {
          iVar9 = pxVar7->line;
          pbVar12 = pbVar13;
          do {
            iVar9 = iVar9 + 1;
            pxVar7->line = iVar9;
            pxVar7->col = 1;
            pbVar13 = pbVar12 + 1;
            pbVar1 = pbVar12 + 1;
            pbVar12 = pbVar13;
          } while (*pbVar1 == 10);
        }
        if (bVar2 != 0x20) break;
        pbVar13 = pbVar13 + 1;
        pxVar7->col = pxVar7->col + 1;
      }
      if (bVar2 == 0x3c) {
        pxVar10 = pxVar7->cur;
        iVar4 = (int)pbVar13 - (int)pxVar10;
        if (iVar4 < 1) {
          return;
        }
        pxVar7->cur = pbVar13;
        p_Var11 = ctxt->sax;
        if (p_Var11 != (_xmlSAXHandler *)0x0) {
          UNRECOVERED_JUMPTABLE = p_Var11->characters;
          p_Var3 = p_Var11->ignorableWhitespace;
          if (p_Var3 != UNRECOVERED_JUMPTABLE) {
            iVar6 = areBlanks(ctxt,pxVar10,iVar4,1);
            if (iVar6 == 0) {
              UNRECOVERED_JUMPTABLE = ctxt->sax->characters;
              if (UNRECOVERED_JUMPTABLE != (charactersSAXFunc)0x0) {
                (*UNRECOVERED_JUMPTABLE)(ctxt->userData,pxVar10,iVar4);
              }
              if (*ctxt->space != -1) {
                return;
              }
              *ctxt->space = -2;
              return;
            }
            UNRECOVERED_JUMPTABLE = ctxt->sax->ignorableWhitespace;
            p_Var3 = UNRECOVERED_JUMPTABLE;
          }
          if (p_Var3 == (charactersSAXFunc)0x0) {
            return;
          }
          (*UNRECOVERED_JUMPTABLE)(ctxt->userData,pxVar10,iVar4);
          return;
        }
        return;
      }
      iVar9 = pxVar7->col;
      while( true ) {
        while( true ) {
          while (""[*pbVar13] != '\0') {
            iVar9 = iVar9 + 1;
            pbVar13 = pbVar13 + 1;
          }
          pxVar7->col = iVar9;
          if (*pbVar13 != 0x5d) break;
          if ((pbVar13[1] == 0x5d) && (pbVar13[2] == 0x3e)) {
            xmlFatalErr(ctxt,XML_ERR_MISPLACED_CDATA_END,(char *)0x0);
            ctxt->input->cur = pbVar13 + 1;
            return;
          }
          iVar9 = iVar9 + 1;
          pxVar7->col = iVar9;
          pbVar13 = pbVar13 + 1;
        }
        if (*pbVar13 != 10) break;
        iVar9 = pxVar7->line;
        do {
          iVar9 = iVar9 + 1;
          pxVar7->line = iVar9;
          pxVar7->col = 1;
          pbVar12 = pbVar13 + 1;
          pbVar13 = pbVar13 + 1;
        } while (*pbVar12 == 10);
        iVar9 = 1;
      }
      pbVar12 = pxVar7->cur;
      len_00 = (int)pbVar13 - (int)pbVar12;
      if (0 < len_00) {
        p_Var11 = ctxt->sax;
        if (p_Var11 != (_xmlSAXHandler *)0x0) {
          UNRECOVERED_JUMPTABLE = p_Var11->characters;
          if (((p_Var11->ignorableWhitespace == UNRECOVERED_JUMPTABLE) || (0x20 < (ulong)*pbVar12))
             || ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0)) {
            iVar6 = iVar9;
            if (UNRECOVERED_JUMPTABLE != (charactersSAXFunc)0x0) {
              (*UNRECOVERED_JUMPTABLE)(ctxt->userData,pbVar12,len_00);
              pxVar7 = ctxt->input;
              iVar6 = pxVar7->col;
            }
            iVar4 = pxVar7->line;
          }
          else {
            pxVar7->cur = pbVar13;
            iVar4 = areBlanks(ctxt,pbVar12,len_00,0);
            if (iVar4 == 0) {
              UNRECOVERED_JUMPTABLE = ctxt->sax->characters;
              if (UNRECOVERED_JUMPTABLE != (charactersSAXFunc)0x0) {
                (*UNRECOVERED_JUMPTABLE)(ctxt->userData,pbVar12,len_00);
              }
              if (*ctxt->space == -1) {
                *ctxt->space = -2;
              }
            }
            else {
              p_Var8 = ctxt->sax->ignorableWhitespace;
              if (p_Var8 != (ignorableWhitespaceSAXFunc)0x0) {
                (*p_Var8)(ctxt->userData,pbVar12,len_00);
              }
            }
            pxVar7 = ctxt->input;
            iVar4 = pxVar7->line;
            iVar6 = pxVar7->col;
          }
        }
        if (ctxt->instate != XML_PARSER_CONTENT) {
          return;
        }
      }
      pxVar7->cur = pbVar13;
      bVar2 = *pbVar13;
      if (bVar2 == 0xd) {
        if (pbVar13[1] != 10) goto LAB_0015bccb;
        pxVar7->cur = pbVar13 + 1;
        pbVar13 = pbVar13 + 2;
        pxVar7->line = pxVar7->line + 1;
        pxVar7->col = 1;
      }
      else {
        if (bVar2 == 0x26) {
          return;
        }
        if (bVar2 == 0x3c) {
          return;
        }
LAB_0015bccb:
        if ((ctxt->progressive == 0) &&
           (((((long)pbVar13 - (long)pxVar7->base < 0x1f5 ||
              (499 < (long)pxVar7->end - (long)pbVar13)) ||
             (xmlSHRINK(ctxt), ctxt->progressive == 0)) &&
            ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)))) {
          xmlGROW(ctxt);
        }
        if (ctxt->instate == XML_PARSER_EOF) {
          return;
        }
        pxVar7 = ctxt->input;
        pbVar13 = pxVar7->cur;
      }
    } while ((byte)(*pbVar13 - 9) < 2 || '\x1f' < (char)*pbVar13);
  }
  pxVar7->line = iVar4;
  pxVar7->col = iVar6;
  if (ctxt->progressive == 0) {
    pxVar10 = pxVar7->cur;
    if ((500 < (long)pxVar10 - (long)pxVar7->base) && ((long)pxVar7->end - (long)pxVar10 < 500)) {
      xmlSHRINK(ctxt);
      if (ctxt->progressive != 0) goto LAB_0015bdcb;
      pxVar7 = ctxt->input;
      pxVar10 = pxVar7->cur;
    }
    if ((long)pxVar7->end - (long)pxVar10 < 0xfa) {
      xmlGROW(ctxt);
    }
  }
LAB_0015bdcb:
  val = xmlCurrentChar(ctxt,&local_16c);
  len = 0;
  iVar4 = 0;
  do {
    xVar5 = ctxt->mlType;
    if (val == 0x3c || xVar5 != XML_TYPE_XML) {
      if (xVar5 != XML_TYPE_SML) goto LAB_0015c1fe;
      if (val == 0x22) {
        if (ctxt->quoted != 0) {
          val = 0x22;
          goto LAB_0015c1fe;
        }
        goto LAB_0015bf07;
      }
      if (val != 0x7d) {
        if (val == 0x26) goto LAB_0015c1fe;
        goto LAB_0015be34;
      }
      val = 0x7d;
      if (ctxt->quoted == 0) goto LAB_0015c1fe;
    }
    else {
      if (val == 0x26) {
        val = 0x26;
        goto LAB_0015c1fe;
      }
LAB_0015be34:
      if ((int)val < 0x100) {
        if (((0xd < val) || ((0x2600U >> (val & 0x1f) & 1) == 0)) && ((int)val < 0x20))
        goto LAB_0015c1fe;
      }
      else if (0xfffff < val - 0x10000 && (0x1ffd < val - 0xe000 && 0xd7ff < val))
      goto LAB_0015c1fe;
      bVar14 = xVar5 == XML_TYPE_SML;
      if ((bVar14) && (ctxt->quoted == 0)) {
LAB_0015bf07:
        if (ctxt->curly == 0) {
          bVar14 = true;
          if (val == 0x5d) goto LAB_0015bead;
          if ((val == 10) || (val == 0x3b)) goto LAB_0015c1fe;
        }
        else if ((0x20 < val) || ((0x100002600U >> ((ulong)val & 0x3f) & 1) == 0))
        goto LAB_0015c1fe;
      }
      else {
        if (val == 0x5d) {
LAB_0015bead:
          pxVar10 = ctxt->input->cur;
          if ((pxVar10[1] == ']') && (pxVar10[2] == '>')) {
            if ((bVar14) && (ctxt->quoted != 0)) {
              val = 0x5d;
              goto LAB_0015bfc2;
            }
            if (cdata != 0) {
              val = 0x5d;
LAB_0015c1fe:
              if (((len != 0) && (buf[(int)len] = '\0', ctxt->sax != (_xmlSAXHandler *)0x0)) &&
                 (ctxt->disableSAX == 0)) {
                iVar4 = areBlanks(ctxt,buf,len,0);
                p_Var11 = ctxt->sax;
                if (iVar4 == 0) {
                  if (p_Var11->characters == (charactersSAXFunc)0x0) {
                    p_Var8 = (ignorableWhitespaceSAXFunc)0x0;
                  }
                  else {
                    (*p_Var11->characters)(ctxt->userData,buf,len);
                    p_Var11 = ctxt->sax;
                    p_Var8 = p_Var11->characters;
                  }
                  if ((p_Var8 != p_Var11->ignorableWhitespace) && (*ctxt->space == -1)) {
                    *ctxt->space = -2;
                  }
                }
                else if (p_Var11->ignorableWhitespace != (ignorableWhitespaceSAXFunc)0x0) {
                  (*p_Var11->ignorableWhitespace)(ctxt->userData,buf,len);
                }
              }
              if (val != 0) {
                if ((int)val < 0x100) {
                  if (0x1f < (int)val) {
                    return;
                  }
                  if ((val < 0xe) && ((0x2600U >> (val & 0x1f) & 1) != 0)) {
                    return;
                  }
                }
                else if (val - 0x10000 < 0x100000 || (val - 0xe000 < 0x1ffe || val < 0xd800)) {
                  return;
                }
                xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,"PCDATA invalid Char value %d\n",val);
                pxVar7 = ctxt->input;
                if (*pxVar7->cur == '\n') {
                  pxVar7->line = pxVar7->line + 1;
                  pxVar7->col = 1;
                }
                else {
                  pxVar7->col = pxVar7->col + 1;
                }
                pxVar7->cur = pxVar7->cur + local_16c;
              }
              return;
            }
            xmlFatalErr(ctxt,XML_ERR_MISPLACED_CDATA_END,(char *)0x0);
            xVar5 = ctxt->mlType;
          }
        }
        if (((xVar5 == XML_TYPE_SML) && (val == 0x5c)) && (ctxt->quoted != 0)) {
          pxVar7 = ctxt->input;
          if (*pxVar7->cur == '\n') {
            pxVar7->line = pxVar7->line + 1;
            pxVar7->col = 1;
          }
          else {
            pxVar7->col = pxVar7->col + 1;
          }
          iVar4 = iVar4 + 1;
          pxVar7->cur = pxVar7->cur + local_16c;
          val = xmlCurrentChar(ctxt,&local_16c);
        }
      }
    }
LAB_0015bfc2:
    if (local_16c == 1) {
      buf[(int)len] = (xmlChar)val;
      len = len + 1;
    }
    else {
      iVar6 = xmlCopyCharMultiByte(buf + (int)len,val);
      len = len + iVar6;
    }
    if (299 < (int)len) {
      buf[len] = '\0';
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) {
        iVar6 = areBlanks(ctxt,buf,len,0);
        p_Var11 = ctxt->sax;
        if (iVar6 == 0) {
          if (p_Var11->characters == (charactersSAXFunc)0x0) {
            p_Var8 = (ignorableWhitespaceSAXFunc)0x0;
          }
          else {
            (*p_Var11->characters)(ctxt->userData,buf,len);
            p_Var11 = ctxt->sax;
            p_Var8 = p_Var11->characters;
          }
          if ((p_Var8 != p_Var11->ignorableWhitespace) && (*ctxt->space == -1)) {
            *ctxt->space = -2;
          }
        }
        else if (p_Var11->ignorableWhitespace != (ignorableWhitespaceSAXFunc)0x0) {
          (*p_Var11->ignorableWhitespace)(ctxt->userData,buf,len);
        }
      }
      len = 0;
      if (ctxt->instate != XML_PARSER_CONTENT) {
        return;
      }
    }
    if (iVar4 < 0x32) {
      iVar4 = iVar4 + 1;
    }
    else {
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      iVar4 = 0;
      if (ctxt->instate == XML_PARSER_EOF) {
        return;
      }
    }
    pxVar7 = ctxt->input;
    if (*pxVar7->cur == '\n') {
      pxVar7->line = pxVar7->line + 1;
      pxVar7->col = 1;
    }
    else {
      pxVar7->col = pxVar7->col + 1;
    }
    pxVar7->cur = pxVar7->cur + local_16c;
    val = xmlCurrentChar(ctxt,&local_16c);
  } while( true );
}

Assistant:

void
xmlParseCharData(xmlParserCtxtPtr ctxt, int cdata) {
    const xmlChar *in;
    int nbchar = 0;
    int line = ctxt->input->line;
    int col = ctxt->input->col;
    int ccol;
    DEBUG_CODE(
    const xmlChar *cur0 = ctxt->input->cur;
    );

    DEBUG_ENTER(("xmlParseCharData(%s, %d);\n", dbgCtxt(ctxt), cdata));

    SHRINK;
    GROW;
    /*
     * Accelerated common case where input don't need to be
     * modified before passing it to the handler.
     */
    if (ISXML && !cdata) {
	in = ctxt->input->cur;
	do {
get_more_space:
	    while (*in == 0x20) { in++; ctxt->input->col++; }
	    if (*in == 0xA) {
		do {
		    ctxt->input->line++; ctxt->input->col = 1;
		    in++;
		} while (*in == 0xA);
		goto get_more_space;
	    }
	    if (*in == '<') {
		nbchar = in - ctxt->input->cur;
		if (nbchar > 0) {
		    const xmlChar *tmp = ctxt->input->cur;
		    ctxt->input->cur = in;

		    if ((ctxt->sax != NULL) &&
		        (ctxt->sax->ignorableWhitespace !=
		         ctxt->sax->characters)) {
			if (areBlanks(ctxt, tmp, nbchar, 1)) {
			    if (ctxt->sax->ignorableWhitespace != NULL)
				ctxt->sax->ignorableWhitespace(ctxt->userData,
						       tmp, nbchar);
			} else {
			    if (ctxt->sax->characters != NULL)
				ctxt->sax->characters(ctxt->userData,
						      tmp, nbchar);
			    if (*ctxt->space == -1)
			        *ctxt->space = -2;
			}
		    } else if ((ctxt->sax != NULL) &&
		               (ctxt->sax->characters != NULL)) {
			ctxt->sax->characters(ctxt->userData,
					      tmp, nbchar);
		    }
		}
		RETURN_COMMENT(("chardata = %s;\n", dbgNStr(cur0, ctxt->input->cur - cur0)));
	    }

get_more:
            ccol = ctxt->input->col;
	    while (test_char_data[*in]) {
		in++;
		ccol++;
	    }
	    ctxt->input->col = ccol;
	    if (*in == 0xA) {
		do {
		    ctxt->input->line++; ctxt->input->col = 1;
		    in++;
		} while (*in == 0xA);
		goto get_more;
	    }
	    if (*in == ']') {
		if ((in[1] == ']') && (in[2] == '>')) {
		    xmlFatalErr(ctxt, XML_ERR_MISPLACED_CDATA_END, NULL);
		    ctxt->input->cur = in + 1;
		    RETURN();
		}
		in++;
		ctxt->input->col++;
		goto get_more;
	    }
	    nbchar = in - ctxt->input->cur;
	    if (nbchar > 0) {
		if ((ctxt->sax != NULL) &&
		    (ctxt->sax->ignorableWhitespace !=
		     ctxt->sax->characters) &&
		    (IS_BLANK_CH(*ctxt->input->cur))) {
		    const xmlChar *tmp = ctxt->input->cur;
		    ctxt->input->cur = in;

		    if (areBlanks(ctxt, tmp, nbchar, 0)) {
		        if (ctxt->sax->ignorableWhitespace != NULL)
			    ctxt->sax->ignorableWhitespace(ctxt->userData,
							   tmp, nbchar);
		    } else {
		        if (ctxt->sax->characters != NULL)
			    ctxt->sax->characters(ctxt->userData,
						  tmp, nbchar);
			if (*ctxt->space == -1)
			    *ctxt->space = -2;
		    }
                    line = ctxt->input->line;
                    col = ctxt->input->col;
		} else if (ctxt->sax != NULL) {
		    if (ctxt->sax->characters != NULL)
			ctxt->sax->characters(ctxt->userData,
					      ctxt->input->cur, nbchar);
                    line = ctxt->input->line;
                    col = ctxt->input->col;
		}
                /* something really bad happened in the SAX callback */
                if (ctxt->instate != XML_PARSER_CONTENT)
                    RETURN();
	    }
	    ctxt->input->cur = in;
	    if (*in == 0xD) {
		in++;
		if (*in == 0xA) {
		    ctxt->input->cur = in;
		    in++;
		    ctxt->input->line++; ctxt->input->col = 1;
		    continue; /* while */
		}
		in--;
	    }
	    if (*in == '<') {
		RETURN_COMMENT(("chardata = %s;\n", dbgNStr(cur0, ctxt->input->cur - cur0)));
	    }
	    if (*in == '&') {
		RETURN_COMMENT(("chardata = %s;\n", dbgNStr(cur0, ctxt->input->cur - cur0)));
	    }
	    SHRINK;
	    GROW;
            if (ctxt->instate == XML_PARSER_EOF)
		RETURN_COMMENT(("chardata = %s;\n", dbgNStr(cur0, ctxt->input->cur - cur0)));
	    in = ctxt->input->cur;
	} while (((*in >= 0x20) && (*in <= 0x7F)) || (*in == 0x09) || (*in == 0x0a));
	nbchar = 0;
    }
    ctxt->input->line = line;
    ctxt->input->col = col;
    xmlParseCharDataComplex(ctxt, cdata);
    /* In this complex case, the output text may be different from the parsed input string */
    RETURN_COMMENT(("parsed = %s;\n", dbgNStr(cur0, ctxt->input->cur - cur0)));
}